

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_bKGD(png_structrp png_ptr,png_const_color_16p back,int color_type)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  undefined8 in_RAX;
  char *warning_message;
  png_size_t pStack_10;
  undefined2 uStack_8;
  png_byte buf [6];
  
  uStack_8 = (undefined2)in_RAX;
  _uStack_8 = in_RAX;
  if (color_type == 3) {
    if ((png_ptr->num_palette == 0) && ((png_ptr->mng_features_permitted & 1) != 0)) {
      bVar4 = back->index;
    }
    else {
      bVar4 = back->index;
      if (png_ptr->num_palette <= (ushort)bVar4) {
        warning_message = "Invalid background palette index";
        goto LAB_0028c953;
      }
    }
    buf._1_5_ = (undefined5)((ulong)in_RAX >> 0x18);
    _uStack_8 = CONCAT12(bVar4,uStack_8);
    pStack_10 = 1;
LAB_0028c964:
    png_write_complete_chunk(png_ptr,0x624b4744,buf,pStack_10);
    return;
  }
  if ((color_type & 2U) == 0) {
    uVar1 = back->gray;
    if ((int)(uint)uVar1 < 1 << (png_ptr->bit_depth & 0x1f)) {
      buf._2_4_ = (undefined4)((ulong)in_RAX >> 0x20);
      _uStack_8 = CONCAT22(uVar1 << 8 | uVar1 >> 8,uStack_8);
      pStack_10 = 2;
      goto LAB_0028c964;
    }
    warning_message = "Ignoring attempt to write bKGD chunk out-of-range for bit_depth";
  }
  else {
    uVar1 = back->red;
    _uStack_8 = CONCAT22(uVar1 << 8 | uVar1 >> 8,uStack_8);
    uVar2 = back->green;
    uVar3 = back->blue;
    _uStack_8 = CONCAT26(uVar3 << 8 | uVar3 >> 8,CONCAT24(uVar2 << 8 | uVar2 >> 8,_uStack_8));
    if ((png_ptr->bit_depth != '\b') ||
       (((char)(uVar2 >> 8) == '\0' && (char)(uVar1 >> 8) == '\0') && (char)(uVar3 >> 8) == '\0')) {
      pStack_10 = 6;
      goto LAB_0028c964;
    }
    warning_message = "Ignoring attempt to write 16-bit bKGD chunk when bit_depth is 8";
  }
LAB_0028c953:
  png_warning(png_ptr,warning_message);
  return;
}

Assistant:

void /* PRIVATE */
png_write_bKGD(png_structrp png_ptr, png_const_color_16p back, int color_type)
{
   png_byte buf[6];

   png_debug(1, "in png_write_bKGD");

   if (color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if (
#ifdef PNG_MNG_FEATURES_SUPPORTED
          (png_ptr->num_palette != 0 ||
          (png_ptr->mng_features_permitted & PNG_FLAG_MNG_EMPTY_PLTE) == 0) &&
#endif
         back->index >= png_ptr->num_palette)
      {
         png_warning(png_ptr, "Invalid background palette index");
         return;
      }

      buf[0] = back->index;
      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)1);
   }

   else if ((color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_save_uint_16(buf, back->red);
      png_save_uint_16(buf + 2, back->green);
      png_save_uint_16(buf + 4, back->blue);
#ifdef PNG_WRITE_16BIT_SUPPORTED
      if (png_ptr->bit_depth == 8 && (buf[0] | buf[2] | buf[4]) != 0)
#else
      if ((buf[0] | buf[2] | buf[4]) != 0)
#endif
      {
         png_warning(png_ptr,
             "Ignoring attempt to write 16-bit bKGD chunk "
             "when bit_depth is 8");

         return;
      }

      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)6);
   }

   else
   {
      if (back->gray >= (1 << png_ptr->bit_depth))
      {
         png_warning(png_ptr,
             "Ignoring attempt to write bKGD chunk out-of-range for bit_depth");

         return;
      }

      png_save_uint_16(buf, back->gray);
      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)2);
   }
}